

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx512::DiscMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar46;
  float fVar47;
  undefined1 auVar45 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  float local_1b0 [4];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar30 [32];
  undefined1 auVar52 [64];
  
  pSVar8 = context->scene;
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar9->time_range).lower;
  uVar23 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar15 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar9->time_range).upper - fVar1));
  auVar34 = vroundss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),9);
  auVar34 = vminss_avx(auVar34,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar26 = vmaxss_avx(ZEXT816(0) << 0x20,auVar34);
  lVar10 = *(long *)&pGVar9[2].numPrimitives;
  lVar20 = (long)(int)auVar26._0_4_ * 0x38;
  lVar11 = *(long *)(lVar10 + lVar20);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar20);
  auVar34 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar35 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar21);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar27 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar19);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar36 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar22);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar20);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar20);
  auVar38 = *(undefined1 (*) [16])(lVar11 + uVar23 * lVar10);
  auVar6 = *(undefined1 (*) [16])(lVar11 + uVar21 * lVar10);
  auVar29 = *(undefined1 (*) [16])(lVar11 + uVar19 * lVar10);
  auVar7 = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar22);
  auVar25 = vpbroadcastd_avx512vl();
  local_210 = vpbroadcastd_avx512vl();
  fVar15 = fVar15 - auVar26._0_4_;
  auVar26 = vunpcklps_avx(auVar34,auVar27);
  auVar34 = vunpckhps_avx(auVar34,auVar27);
  auVar27 = vunpcklps_avx(auVar35,auVar36);
  auVar35 = vunpckhps_avx(auVar35,auVar36);
  auVar28 = vunpcklps_avx(auVar26,auVar27);
  auVar27 = vunpckhps_avx(auVar26,auVar27);
  auVar26 = vunpcklps_avx(auVar34,auVar35);
  auVar32 = vunpcklps_avx(auVar38,auVar29);
  auVar36 = vunpckhps_avx(auVar38,auVar29);
  auVar29 = vunpcklps_avx(auVar6,auVar7);
  auVar38 = vunpckhps_avx(auVar6,auVar7);
  auVar7 = vunpcklps_avx(auVar32,auVar29);
  auVar6 = vunpckhps_avx(auVar32,auVar29);
  auVar29 = vunpcklps_avx(auVar36,auVar38);
  fVar1 = 1.0 - fVar15;
  auVar43._4_4_ = fVar1;
  auVar43._0_4_ = fVar1;
  auVar43._8_4_ = fVar1;
  auVar43._12_4_ = fVar1;
  auVar42._0_4_ = fVar15 * auVar7._0_4_;
  auVar42._4_4_ = fVar15 * auVar7._4_4_;
  auVar42._8_4_ = fVar15 * auVar7._8_4_;
  auVar42._12_4_ = fVar15 * auVar7._12_4_;
  auVar45._0_4_ = fVar15 * auVar6._0_4_;
  auVar45._4_4_ = fVar15 * auVar6._4_4_;
  auVar45._8_4_ = fVar15 * auVar6._8_4_;
  auVar45._12_4_ = fVar15 * auVar6._12_4_;
  auVar49._0_4_ = fVar15 * auVar29._0_4_;
  auVar49._4_4_ = fVar15 * auVar29._4_4_;
  auVar49._8_4_ = fVar15 * auVar29._8_4_;
  auVar49._12_4_ = fVar15 * auVar29._12_4_;
  auVar6 = vfmadd231ps_fma(auVar42,auVar43,auVar28);
  auVar29 = vfmadd231ps_fma(auVar45,auVar43,auVar27);
  auVar7 = vfmadd231ps_fma(auVar49,auVar43,auVar26);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar32._4_4_ = fVar1;
  auVar32._0_4_ = fVar1;
  auVar32._8_4_ = fVar1;
  auVar32._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar33._4_4_ = fVar2;
  auVar33._0_4_ = fVar2;
  auVar33._8_4_ = fVar2;
  auVar33._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar27 = vfmadd231ps_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar33,auVar33);
  auVar27 = vfmadd231ps_fma(auVar27,auVar32,auVar32);
  auVar28._0_4_ = auVar27._0_4_;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  auVar26 = vrcp14ps_avx512vl(auVar28);
  auVar27._8_4_ = 0x3f800000;
  auVar27._0_8_ = 0x3f8000003f800000;
  auVar27._12_4_ = 0x3f800000;
  auVar27 = vfnmadd213ps_avx512vl(auVar28,auVar26,auVar27);
  auVar27 = vfmadd132ps_fma(auVar27,auVar26,auVar26);
  uVar4 = *(undefined4 *)(ray + k * 4);
  auVar26._4_4_ = uVar4;
  auVar26._0_4_ = uVar4;
  auVar26._8_4_ = uVar4;
  auVar26._12_4_ = uVar4;
  auVar26 = vsubps_avx512vl(auVar6,auVar26);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar6._4_4_ = uVar4;
  auVar6._0_4_ = uVar4;
  auVar6._8_4_ = uVar4;
  auVar6._12_4_ = uVar4;
  auVar28 = vsubps_avx512vl(auVar29,auVar6);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar29._4_4_ = uVar4;
  auVar29._0_4_ = uVar4;
  auVar29._8_4_ = uVar4;
  auVar29._12_4_ = uVar4;
  auVar29 = vsubps_avx512vl(auVar7,auVar29);
  fVar44 = auVar29._0_4_;
  auVar50._0_4_ = fVar44 * fVar3;
  fVar46 = auVar29._4_4_;
  auVar50._4_4_ = fVar46 * fVar3;
  fVar47 = auVar29._8_4_;
  auVar50._8_4_ = fVar47 * fVar3;
  fVar48 = auVar29._12_4_;
  auVar50._12_4_ = fVar48 * fVar3;
  auVar6 = vfmadd231ps_fma(auVar50,auVar28,auVar33);
  auVar6 = vfmadd231ps_fma(auVar6,auVar26,auVar32);
  local_1e0._0_4_ = auVar6._0_4_ * auVar27._0_4_;
  local_1e0._4_4_ = auVar6._4_4_ * auVar27._4_4_;
  local_1e0._8_4_ = auVar6._8_4_ * auVar27._8_4_;
  local_1e0._12_4_ = auVar6._12_4_ * auVar27._12_4_;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar51._4_4_ = uVar4;
  auVar51._0_4_ = uVar4;
  auVar51._8_4_ = uVar4;
  auVar51._12_4_ = uVar4;
  auVar52 = ZEXT1664(auVar51);
  uVar16 = vcmpps_avx512vl(local_1e0,auVar51,2);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar7._4_4_ = uVar4;
  auVar7._0_4_ = uVar4;
  auVar7._8_4_ = uVar4;
  auVar7._12_4_ = uVar4;
  uVar17 = vcmpps_avx512vl(local_1e0,auVar7,0xd);
  uVar18 = vpcmpgtd_avx512vl(auVar25,_DAT_01f7fcf0);
  bVar24 = (byte)uVar16 & (byte)uVar17 & 0xf & (byte)uVar18;
  if (bVar24 != 0) {
    auVar34 = vunpckhps_avx(auVar34,auVar35);
    auVar35 = vunpckhps_avx(auVar36,auVar38);
    auVar36._0_4_ = fVar15 * auVar35._0_4_;
    auVar36._4_4_ = fVar15 * auVar35._4_4_;
    auVar36._8_4_ = fVar15 * auVar35._8_4_;
    auVar36._12_4_ = fVar15 * auVar35._12_4_;
    auVar36 = vfmadd231ps_fma(auVar36,auVar43,auVar34);
    auVar34._0_4_ = fVar1 * local_1e0._0_4_;
    auVar34._4_4_ = fVar1 * local_1e0._4_4_;
    auVar34._8_4_ = fVar1 * local_1e0._8_4_;
    auVar34._12_4_ = fVar1 * local_1e0._12_4_;
    auVar38._0_4_ = fVar2 * local_1e0._0_4_;
    auVar38._4_4_ = fVar2 * local_1e0._4_4_;
    auVar38._8_4_ = fVar2 * local_1e0._8_4_;
    auVar38._12_4_ = fVar2 * local_1e0._12_4_;
    auVar25._0_4_ = fVar3 * local_1e0._0_4_;
    auVar25._4_4_ = fVar3 * local_1e0._4_4_;
    auVar25._8_4_ = fVar3 * local_1e0._8_4_;
    auVar25._12_4_ = fVar3 * local_1e0._12_4_;
    auVar34 = vsubps_avx(auVar26,auVar34);
    auVar35 = vsubps_avx(auVar28,auVar38);
    auVar27 = vsubps_avx(auVar29,auVar25);
    auVar39._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar39._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar39._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar39._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar35 = vfmadd231ps_fma(auVar39,auVar35,auVar35);
    auVar34 = vfmadd231ps_fma(auVar35,auVar34,auVar34);
    auVar35._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar35._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar35._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar35._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    uVar16 = vcmpps_avx512vl(auVar34,auVar35,2);
    bVar24 = (byte)uVar16 & bVar24;
    if (bVar24 != 0) {
      auVar37._0_4_ = fVar44 * fVar44;
      auVar37._4_4_ = fVar46 * fVar46;
      auVar37._8_4_ = fVar47 * fVar47;
      auVar37._12_4_ = fVar48 * fVar48;
      auVar34 = vfmadd213ps_fma(auVar28,auVar28,auVar37);
      auVar34 = vfmadd213ps_fma(auVar26,auVar26,auVar34);
      uVar16 = vcmpps_avx512vl(auVar34,auVar35,6);
      if ((bVar24 & (byte)uVar16) != 0) {
        local_200 = ZEXT432(0) << 0x20;
        local_1d0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_1d0._8_4_ = -fVar1;
        local_1d0._12_4_ = -fVar1;
        local_1c0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
        local_1c0._8_4_ = -fVar2;
        local_1c0._12_4_ = -fVar2;
        local_1b0[0] = -fVar3;
        local_1b0[1] = -fVar3;
        local_1b0[2] = -fVar3;
        local_1b0[3] = -fVar3;
        uVar23 = (ulong)(bVar24 & (byte)uVar16);
        auVar31 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar40 = ZEXT3264(auVar31);
        auVar31 = ZEXT1632(CONCAT412(fVar15,CONCAT48(fVar15,CONCAT44(fVar15,fVar15))));
        auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
        auVar41 = ZEXT3264(auVar31);
        do {
          local_270.hit = local_180;
          local_270.valid = (int *)local_240;
          uVar21 = 0;
          for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            uVar21 = uVar21 + 1;
          }
          pGVar9 = (pSVar8->geometries).items[*(uint *)(local_210 + uVar21 * 4)].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar19 = (ulong)(uint)((int)uVar21 * 4);
            uVar4 = *(undefined4 *)(local_200 + uVar19);
            local_120._4_4_ = uVar4;
            local_120._0_4_ = uVar4;
            local_120._8_4_ = uVar4;
            local_120._12_4_ = uVar4;
            local_120._16_4_ = uVar4;
            local_120._20_4_ = uVar4;
            local_120._24_4_ = uVar4;
            local_120._28_4_ = uVar4;
            uVar4 = *(undefined4 *)(local_200 + uVar19 + 0x10);
            local_100._4_4_ = uVar4;
            local_100._0_4_ = uVar4;
            local_100._8_4_ = uVar4;
            local_100._12_4_ = uVar4;
            local_100._16_4_ = uVar4;
            local_100._20_4_ = uVar4;
            local_100._24_4_ = uVar4;
            local_100._28_4_ = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1e0 + uVar19);
            local_270.context = context->user;
            local_c0 = vpbroadcastd_avx512vl();
            uVar4 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar19);
            local_e0._4_4_ = uVar4;
            local_e0._0_4_ = uVar4;
            local_e0._8_4_ = uVar4;
            local_e0._12_4_ = uVar4;
            local_e0._16_4_ = uVar4;
            local_e0._20_4_ = uVar4;
            local_e0._24_4_ = uVar4;
            local_e0._28_4_ = uVar4;
            uVar4 = *(undefined4 *)(local_1d0 + uVar19);
            uVar5 = *(undefined4 *)(local_1c0 + uVar19);
            local_160._4_4_ = uVar5;
            local_160._0_4_ = uVar5;
            local_160._8_4_ = uVar5;
            local_160._12_4_ = uVar5;
            local_160._16_4_ = uVar5;
            local_160._20_4_ = uVar5;
            local_160._24_4_ = uVar5;
            local_160._28_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)local_1b0 + uVar19);
            local_140._4_4_ = uVar5;
            local_140._0_4_ = uVar5;
            local_140._8_4_ = uVar5;
            local_140._12_4_ = uVar5;
            local_140._16_4_ = uVar5;
            local_140._20_4_ = uVar5;
            local_140._24_4_ = uVar5;
            local_140._28_4_ = uVar5;
            local_180[0] = (RTCHitN)(char)uVar4;
            local_180[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[4] = (RTCHitN)(char)uVar4;
            local_180[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[8] = (RTCHitN)(char)uVar4;
            local_180[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[0xc] = (RTCHitN)(char)uVar4;
            local_180[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[0x10] = (RTCHitN)(char)uVar4;
            local_180[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[0x14] = (RTCHitN)(char)uVar4;
            local_180[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[0x18] = (RTCHitN)(char)uVar4;
            local_180[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            local_180[0x1c] = (RTCHitN)(char)uVar4;
            local_180[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
            uStack_9c = (local_270.context)->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = (local_270.context)->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            local_240 = auVar40._0_32_;
            local_270.geometryUserPtr = pGVar9->userPtr;
            local_270.N = 8;
            local_220 = auVar52._0_16_;
            local_1a0 = local_240;
            local_270.ray = (RTCRayN *)ray;
            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar31 = ZEXT1632(auVar41._0_16_);
              (*pGVar9->occlusionFilterN)(&local_270);
              auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
              auVar41 = ZEXT3264(auVar31);
              auVar40 = ZEXT3264(local_1a0);
              auVar52 = ZEXT1664(local_220);
            }
            if (local_240 != (undefined1  [32])0x0) {
              p_Var13 = context->args->filter;
              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                auVar31 = ZEXT1632(auVar41._0_16_);
                (*p_Var13)(&local_270);
                auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
                auVar41 = ZEXT3264(auVar31);
                auVar40 = ZEXT3264(local_1a0);
                auVar52 = ZEXT1664(local_220);
              }
              uVar19 = vptestmd_avx512vl(local_240,local_240);
              auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar14 = (bool)((byte)uVar19 & 1);
              auVar31._0_4_ =
                   (uint)bVar14 * auVar30._0_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x100);
              bVar14 = (bool)((byte)(uVar19 >> 1) & 1);
              auVar31._4_4_ =
                   (uint)bVar14 * auVar30._4_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x104);
              bVar14 = (bool)((byte)(uVar19 >> 2) & 1);
              auVar31._8_4_ =
                   (uint)bVar14 * auVar30._8_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x108);
              bVar14 = (bool)((byte)(uVar19 >> 3) & 1);
              auVar31._12_4_ =
                   (uint)bVar14 * auVar30._12_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x10c);
              bVar14 = (bool)((byte)(uVar19 >> 4) & 1);
              auVar31._16_4_ =
                   (uint)bVar14 * auVar30._16_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x110);
              bVar14 = (bool)((byte)(uVar19 >> 5) & 1);
              auVar31._20_4_ =
                   (uint)bVar14 * auVar30._20_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x114);
              bVar14 = (bool)((byte)(uVar19 >> 6) & 1);
              auVar31._24_4_ =
                   (uint)bVar14 * auVar30._24_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x118);
              bVar14 = SUB81(uVar19 >> 7,0);
              auVar31._28_4_ =
                   (uint)bVar14 * auVar30._28_4_ | (uint)!bVar14 * *(int *)(local_270.ray + 0x11c);
              *(undefined1 (*) [32])(local_270.ray + 0x100) = auVar31;
              if (local_240 != (undefined1  [32])0x0) {
                return true;
              }
            }
            *(int *)(ray + k * 4 + 0x100) = auVar52._0_4_;
          }
          uVar23 = uVar23 ^ 1L << (uVar21 & 0x3f);
        } while (uVar23 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0, Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }